

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *pNtk,Vec_Ptr_t *vOrder)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  char *pSop;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pTerm;
  Gia_Obj_t *pGiaObj;
  Gia_Man_t *pGia;
  Gia_Man_t *pGiaBox;
  Abc_Ntk_t *pNtkModel;
  int gFanins [16];
  Vec_Ptr_t *vOrder_local;
  Abc_Ntk_t *pNtk_local;
  
  gFanins._56_8_ = vOrder;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                  ,0x155,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                  ,0x156,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(0x8000);
  pcVar4 = Abc_NtkName(pNtk);
  pcVar4 = Abc_UtilStrsav(pcVar4);
  p->pName = pcVar4;
  pcVar4 = Abc_NtkSpec(pNtk);
  pcVar4 = Abc_UtilStrsav(pcVar4);
  p->pSpec = pcVar4;
  Gia_ManHashAlloc(p);
  for (pSop._4_4_ = 0; iVar1 = Abc_NtkPiNum(pNtk), pSop._4_4_ < iVar1; pSop._4_4_ = pSop._4_4_ + 1)
  {
    pAVar5 = Abc_NtkPi(pNtk,pSop._4_4_);
    iVar1 = Gia_ManAppendCi(p);
    pAVar5 = Abc_ObjFanout0(pAVar5);
    (pAVar5->field_6).iTemp = iVar1;
  }
  pSop._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)gFanins._56_8_);
    if (iVar1 <= pSop._4_4_) {
      for (pSop._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), pSop._4_4_ < iVar1;
          pSop._4_4_ = pSop._4_4_ + 1) {
        pAVar5 = Abc_NtkPo(pNtk,pSop._4_4_);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        Gia_ManAppendCo(p,(pAVar5->field_6).iTemp);
      }
      Gia_ManHashStop(p);
      Gia_ManSetRegNum(p,0);
      pGVar8 = Gia_ManCleanup(p);
      Gia_ManStop(p);
      uVar3 = Abc_NtkCountAndNodes((Vec_Ptr_t *)gFanins._56_8_);
      printf("%8d -> ",(ulong)uVar3);
      Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
      return pGVar8;
    }
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)gFanins._56_8_,pSop._4_4_);
    iVar1 = Abc_ObjIsNode(pAVar5);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsBox(pAVar5);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x171,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      pNtk_00 = (Abc_Ntk_t *)(pAVar5->field_5).pData;
      iVar1 = Abc_ObjFaninNum(pAVar5);
      iVar2 = Abc_NtkPiNum(pNtk_00);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x174,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      iVar1 = Abc_ObjFanoutNum(pAVar5);
      iVar2 = Abc_NtkPoNum(pNtk_00);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x175,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      pGVar8 = (Gia_Man_t *)pNtk_00->pData;
      iVar1 = Abc_ObjFaninNum(pAVar5);
      iVar2 = Gia_ManPiNum(pGVar8);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x182,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      iVar1 = Abc_ObjFanoutNum(pAVar5);
      iVar2 = Gia_ManPoNum(pGVar8);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x183,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      Gia_ManFillValue(pGVar8);
      pGVar7 = Gia_ManConst0(pGVar8);
      pGVar7->Value = 0;
      for (pSop._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar5), (int)pSop < iVar1;
          pSop._0_4_ = (int)pSop + 1) {
        pAVar6 = Abc_ObjFanin(pAVar5,(int)pSop);
        pAVar6 = Abc_ObjFanin0(pAVar6);
        uVar3 = (pAVar6->field_6).iTemp;
        pGVar7 = Gia_ManPi(pGVar8,(int)pSop);
        pGVar7->Value = uVar3;
      }
      pSop._0_4_ = 0;
      while( true ) {
        bVar9 = false;
        if ((int)pSop < pGVar8->nObjs) {
          pTerm = (Abc_Obj_t *)Gia_ManObj(pGVar8,(int)pSop);
          bVar9 = pTerm != (Abc_Obj_t *)0x0;
        }
        if (!bVar9) break;
        iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pTerm);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pTerm);
          iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)pTerm);
          iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
          *(int *)&pTerm->pNext = iVar1;
        }
        pSop._0_4_ = (int)pSop + 1;
      }
      for (pSop._0_4_ = 0; iVar1 = Abc_ObjFanoutNum(pAVar5), (int)pSop < iVar1;
          pSop._0_4_ = (int)pSop + 1) {
        pAVar6 = Abc_ObjFanout(pAVar5,(int)pSop);
        pGVar7 = Gia_ManPo(pGVar8,(int)pSop);
        iVar1 = Gia_ObjFanin0Copy(pGVar7);
        pAVar6 = Abc_ObjFanout0(pAVar6);
        (pAVar6->field_6).iTemp = iVar1;
      }
    }
    else {
      pcVar4 = (char *)(pAVar5->field_5).pData;
      iVar1 = Abc_ObjFaninNum(pAVar5);
      if (0x10 < iVar1) {
        __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x167,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      iVar1 = Abc_ObjFaninNum(pAVar5);
      iVar2 = Abc_SopGetVarNum(pcVar4);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x168,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      for (pSop._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar5), (int)pSop < iVar1;
          pSop._0_4_ = (int)pSop + 1) {
        pAVar6 = Abc_ObjFanin(pAVar5,(int)pSop);
        gFanins[(long)(int)pSop + -2] = (pAVar6->field_6).iTemp;
        if (gFanins[(long)(int)pSop + -2] < 0) {
          __assert_fail("gFanins[k] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                        ,0x16c,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
      }
      iVar1 = Abc_NtkDeriveFlatGiaSop(p,(int *)&pNtkModel,pcVar4);
      pAVar5 = Abc_ObjFanout0(pAVar5);
      (pAVar5->field_6).iTemp = iVar1;
    }
    pSop._4_4_ = pSop._4_4_ + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive( Abc_Ntk_t * pNtk, Vec_Ptr_t * vOrder )
{
    int gFanins[16];
    Abc_Ntk_t * pNtkModel;
    Gia_Man_t * pGiaBox, * pGia = NULL;
    Gia_Obj_t * pGiaObj;
    Abc_Obj_t * pTerm, * pObj;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // start the network
    pGia = Gia_ManStart( (1<<15) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
/*
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
*/ 
        // duplicate the AIG
        pGiaBox = (Gia_Man_t *)pNtkModel->pData;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox) );
        assert( Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox) );
        Gia_ManFillValue( pGiaBox );
        Gia_ManConst0(pGiaBox)->Value = 0;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Gia_ManPi(pGiaBox, k)->Value = Abc_ObjFanin0(pTerm)->iTemp;
        Gia_ManForEachAnd( pGiaBox, pGiaObj, k )
            pGiaObj->Value = Gia_ManHashAnd( pGia, Gia_ObjFanin0Copy(pGiaObj), Gia_ObjFanin1Copy(pGiaObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Gia_ObjFanin0Copy(Gia_ManPo(pGiaBox, k));
    }
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pGiaBox = pGia );
    Gia_ManStop( pGiaBox );

    printf( "%8d -> ", Abc_NtkCountAndNodes(vOrder) );
    Gia_ManPrintStats( pGia, NULL );
    return pGia;
}